

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Value * json_value_init_number(double number)

{
  JSON_Value *pJVar1;
  
  if (0x7fefffffffffffff < (ulong)ABS(number)) {
    return (JSON_Value *)0x0;
  }
  pJVar1 = (JSON_Value *)(*parson_malloc)(0x20);
  if (pJVar1 == (JSON_Value *)0x0) {
    pJVar1 = (JSON_Value *)0x0;
  }
  else {
    pJVar1->parent = (JSON_Value *)0x0;
    pJVar1->type = 3;
    (pJVar1->value).number = number;
  }
  return pJVar1;
}

Assistant:

JSON_Value * json_value_init_number(double number) {
    JSON_Value *new_value = NULL;
    if (IS_NUMBER_INVALID(number)) {
        return NULL;
    }
    new_value = (JSON_Value*)parson_malloc(sizeof(JSON_Value));
    if (new_value == NULL) {
        return NULL;
    }
    new_value->parent = NULL;
    new_value->type = JSONNumber;
    new_value->value.number = number;
    return new_value;
}